

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::set_char(dynamic_string *this,uint index,char c)

{
  char in_DL;
  uint7 in_register_00000011;
  uint in_ESI;
  dynamic_string *in_RDI;
  undefined3 in_stack_fffffffffffffff0;
  
  if (in_DL == '\0') {
    truncate(in_RDI,(char *)(ulong)in_ESI,(ulong)in_register_00000011 << 8);
  }
  else if (in_ESI < in_RDI->m_len) {
    in_RDI->m_pStr[in_ESI] = in_DL;
    check(in_RDI);
  }
  else if (in_ESI == in_RDI->m_len) {
    append_char((dynamic_string *)CONCAT44(in_ESI,CONCAT13(in_DL,in_stack_fffffffffffffff0)),
                (char)((ulong)in_RDI >> 0x38));
  }
  return in_RDI;
}

Assistant:

dynamic_string& dynamic_string::set_char(uint index, char c) {
  CRNLIB_ASSERT(index <= m_len);

  if (!c)
    truncate(index);
  else if (index < m_len) {
    m_pStr[index] = c;

    check();
  } else if (index == m_len)
    append_char(c);

  return *this;
}